

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O1

bool __thiscall DyndepLoader::UpdateEdge(DyndepLoader *this,Edge *edge,Dyndeps *dyndeps,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BindingEnv *this_00;
  Node *pNVar2;
  Edge *pEVar3;
  const_iterator i;
  pointer ppNVar4;
  bool bVar5;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  if (dyndeps->restat_ == true) {
    this_00 = edge->env_;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"restat","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"1","");
    BindingEnv::AddBinding(this_00,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<Node*,std::allocator<Node*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>>
            ((vector<Node*,std::allocator<Node*>> *)&edge->outputs_,
             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ppNVar4 = (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  edge->implicit_outs_ =
       edge->implicit_outs_ +
       (int)((ulong)((long)(dyndeps->implicit_outputs_).
                           super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppNVar4) >> 3);
  bVar5 = ppNVar4 ==
          (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar5) {
    pNVar2 = *ppNVar4;
    pEVar3 = pNVar2->in_edge_;
    while (pEVar3 == (Edge *)0x0) {
      ppNVar4 = ppNVar4 + 1;
      pNVar2->in_edge_ = edge;
      bVar5 = ppNVar4 ==
              (dyndeps->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      if (bVar5) goto LAB_00183f84;
      pNVar2 = *ppNVar4;
      pEVar3 = pNVar2->in_edge_;
    }
    std::operator+(&local_70,"multiple rules generate ",&(*ppNVar4)->path_);
    std::__cxx11::string::operator=((string *)err,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar5 == false) {
      return false;
    }
  }
LAB_00183f84:
  std::vector<Node*,std::allocator<Node*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>>
            ((vector<Node*,std::allocator<Node*>> *)&edge->inputs_,
             (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish + -(long)edge->order_only_deps_,
             (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
             .super__Vector_impl_data._M_start,
             (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  ppNVar4 = (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  edge->implicit_deps_ =
       edge->implicit_deps_ +
       (int)((ulong)((long)(dyndeps->implicit_inputs_).
                           super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppNVar4) >> 3);
  for (; ppNVar4 !=
         (dyndeps->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppNVar4 = ppNVar4 + 1) {
    Node::AddOutEdge(*ppNVar4,edge);
  }
  return bVar5;
}

Assistant:

bool DyndepLoader::UpdateEdge(Edge* edge, Dyndeps const* dyndeps,
                              std::string* err) const {
  // Add dyndep-discovered bindings to the edge.
  // We know the edge already has its own binding
  // scope because it has a "dyndep" binding.
  if (dyndeps->restat_)
    edge->env_->AddBinding("restat", "1");

  // Add the dyndep-discovered outputs to the edge.
  edge->outputs_.insert(edge->outputs_.end(),
                        dyndeps->implicit_outputs_.begin(),
                        dyndeps->implicit_outputs_.end());
  edge->implicit_outs_ += dyndeps->implicit_outputs_.size();

  // Add this edge as incoming to each new output.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_outputs_.begin();
       i != dyndeps->implicit_outputs_.end(); ++i) {
    if ((*i)->in_edge() != NULL) {
      *err = "multiple rules generate " + (*i)->path();
      return false;
    }
    (*i)->set_in_edge(edge);
  }

  // Add the dyndep-discovered inputs to the edge.
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       dyndeps->implicit_inputs_.begin(),
                       dyndeps->implicit_inputs_.end());
  edge->implicit_deps_ += dyndeps->implicit_inputs_.size();

  // Add this edge as outgoing from each new input.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_inputs_.begin();
       i != dyndeps->implicit_inputs_.end(); ++i)
    (*i)->AddOutEdge(edge);

  return true;
}